

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# membrane-test.c++
# Opt level: O3

Promise<void> __thiscall
capnp::_::anon_unknown_0::TestMembraneImpl::loopback(TestMembraneImpl *this,LoopbackContext context)

{
  ClientHook *pCVar1;
  int iVar2;
  long *in_RDX;
  bool bVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  Own<capnp::ClientHook,_std::nullptr_t> local_d8;
  PointerReader local_c8;
  PointerReader local_a8;
  StructBuilder local_88;
  StructReader local_58;
  
  local_a8.segment._0_1_ = 0;
  (**(code **)(*in_RDX + 0x10))(&local_c8);
  local_58.data = local_c8.pointer;
  local_58.segment = local_c8.segment;
  local_58.capTable = local_c8.capTable;
  PointerBuilder::getStruct(&local_88,(PointerBuilder *)&local_58,(StructSize)0x10000,(word *)0x0);
  (**(code **)*in_RDX)(&local_a8);
  local_c8.segment = (SegmentReader *)CONCAT71(local_a8.segment._1_7_,local_a8.segment._0_1_);
  local_c8.pointer = local_a8.pointer;
  local_c8.nestingLimit = local_a8.nestingLimit;
  local_c8._28_4_ = local_a8._28_4_;
  local_c8.capTable = local_a8.capTable;
  PointerReader::getStruct(&local_58,&local_c8,(word *)0x0);
  bVar3 = local_58.pointerCount != 0;
  local_c8.pointer = (WirePointer *)0x0;
  if (bVar3) {
    local_c8.pointer = local_58.pointers;
  }
  iVar2 = 0x7fffffff;
  if (bVar3) {
    iVar2 = local_58.nestingLimit;
  }
  uVar4 = 0;
  uVar5 = 0;
  uVar6 = 0;
  uVar7 = 0;
  if (bVar3) {
    uVar4 = local_58.segment._0_4_;
    uVar5 = local_58.segment._4_4_;
    uVar6 = local_58.capTable._0_4_;
    uVar7 = local_58.capTable._4_4_;
  }
  local_c8.segment = (SegmentReader *)CONCAT44(uVar5,uVar4);
  local_c8.capTable = (CapTableReader *)CONCAT44(uVar7,uVar6);
  local_c8.nestingLimit = iVar2;
  PointerReader::getCapability(&local_a8);
  local_d8.disposer = (Disposer *)CONCAT71(local_a8.segment._1_7_,local_a8.segment._0_1_);
  local_d8.ptr = (ClientHook *)local_a8.capTable;
  local_c8.segment = &(local_88.segment)->super_SegmentReader;
  local_c8.capTable = &(local_88.capTable)->super_CapTableReader;
  local_c8.pointer = local_88.pointers;
  PointerBuilder::setCapability((PointerBuilder *)&local_c8,&local_d8);
  pCVar1 = local_d8.ptr;
  if (local_d8.ptr != (ClientHook *)0x0) {
    local_d8.ptr = (ClientHook *)0x0;
    (**(local_d8.disposer)->_vptr_Disposer)
              (local_d8.disposer,pCVar1->_vptr_ClientHook[-2] + (long)&pCVar1->_vptr_ClientHook);
  }
  kj::_::readyNow();
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<void> loopback(LoopbackContext context) override {
    context.getResults().setThing(context.getParams().getThing());
    return kj::READY_NOW;
  }